

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O0

Result wabt::ParseInt<unsigned_char>(char *s,char *end,uchar *out,ParseIntType parse_type)

{
  ulong uVar1;
  bool bVar2;
  char cVar3;
  byte bVar4;
  Result result;
  bool bVar5;
  ulong uStack_38;
  bool has_sign;
  uint64_t value;
  uchar *puStack_28;
  ParseIntType parse_type_local;
  uchar *out_local;
  char *end_local;
  char *s_local;
  
  bVar5 = false;
  value._4_4_ = parse_type;
  puStack_28 = out;
  out_local = (uchar *)end;
  end_local = s;
  if ((*s == '-') || (*s == '+')) {
    if (parse_type == UnsignedOnly) {
      Result::Result((Result *)((long)&s_local + 4),Error);
      return (Result)s_local._4_4_;
    }
    bVar5 = *s == '-';
    end_local = s + 1;
  }
  result = ParseUint64(end_local,end,&stack0xffffffffffffffc8);
  bVar2 = Failed(result);
  uVar1 = uStack_38;
  if (bVar2) {
    Result::Result((Result *)((long)&s_local + 4),Error);
  }
  else {
    if (bVar5) {
      cVar3 = std::numeric_limits<signed_char>::max();
      if ((long)cVar3 + 1U < uVar1) {
        Result::Result((Result *)((long)&s_local + 4),Error);
        return (Result)s_local._4_4_;
      }
      bVar4 = std::numeric_limits<unsigned_char>::max();
      uStack_38 = (bVar4 - uStack_38) + 1;
    }
    else {
      bVar4 = std::numeric_limits<unsigned_char>::max();
      if (bVar4 < uVar1) {
        Result::Result((Result *)((long)&s_local + 4),Error);
        return (Result)s_local._4_4_;
      }
    }
    *puStack_28 = (uchar)uStack_38;
    Result::Result((Result *)((long)&s_local + 4),Ok);
  }
  return (Result)s_local._4_4_;
}

Assistant:

Result ParseInt(const char* s,
                const char* end,
                U* out,
                ParseIntType parse_type) {
  using S = typename std::make_signed<U>::type;
  uint64_t value;
  bool has_sign = false;
  if (*s == '-' || *s == '+') {
    if (parse_type == ParseIntType::UnsignedOnly) {
      return Result::Error;
    }
    if (*s == '-') {
      has_sign = true;
    }
    s++;
  }
  CHECK_RESULT(ParseUint64(s, end, &value));

  if (has_sign) {
    // abs(INTN_MIN) == INTN_MAX + 1.
    if (value > static_cast<uint64_t>(std::numeric_limits<S>::max()) + 1) {
      return Result::Error;
    }
    value = std::numeric_limits<U>::max() - value + 1;
  } else {
    if (value > static_cast<uint64_t>(std::numeric_limits<U>::max())) {
      return Result::Error;
    }
  }
  *out = static_cast<U>(value);
  return Result::Ok;
}